

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVec2 *pIVar1;
  ImVec2 local_44;
  int local_3c;
  float local_38;
  int i_step;
  float t_step;
  ImVec2 p1;
  int num_segments_local;
  ImVec2 *p4_local;
  ImVec2 *p3_local;
  ImVec2 *p2_local;
  ImDrawList *this_local;
  
  p1.x = (float)num_segments;
  unique0x100000dc = p4;
  pIVar1 = ImVector<ImVec2>::back(&this->_Path);
  _i_step = *pIVar1;
  if (p1.x == 0.0) {
    PathBezierToCasteljau
              (&this->_Path,(float)i_step,t_step,p2->x,p2->y,p3->x,p3->y,stack0xffffffffffffffd8->x,
               stack0xffffffffffffffd8->y,this->_Data->CurveTessellationTol,0);
  }
  else {
    local_38 = 1.0 / (float)(int)p1.x;
    for (local_3c = 1; local_3c <= (int)p1.x; local_3c = local_3c + 1) {
      local_44 = ImBezierCalc((ImVec2 *)&i_step,p2,p3,stack0xffffffffffffffd8,
                              local_38 * (float)local_3c);
      ImVector<ImVec2>::push_back(&this->_Path,&local_44);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0); // Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierCalc(p1, p2, p3, p4, t_step * i_step));
    }
}